

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.cc
# Opt level: O0

void __thiscall qpdf::Tokenizer::inComment(Tokenizer *this,char ch)

{
  char ch_local;
  Tokenizer *this_local;
  
  if ((ch == '\r') || (ch == '\n')) {
    if ((this->include_ignorable & 1U) == 0) {
      this->state = st_before_token;
    }
    else {
      this->type = tt_comment;
      this->in_token = false;
      this->char_to_unread = ch;
      this->state = st_token_ready;
    }
  }
  return;
}

Assistant:

void
Tokenizer::inComment(char ch)
{
    if ((ch == '\r') || (ch == '\n')) {
        if (include_ignorable) {
            type = tt::tt_comment;
            in_token = false;
            char_to_unread = ch;
            state = st_token_ready;
        } else {
            state = st_before_token;
        }
    }
}